

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O0

void __thiscall PrintVisitor::visit(PrintVisitor *this,LambdaCallNode *node)

{
  bool bVar1;
  ostream *poVar2;
  element_type *peVar3;
  LambdaNode *pLVar4;
  long *in_RSI;
  long in_RDI;
  shared_ptr<ExpressionNode> *arg;
  const_iterator __end1;
  const_iterator __begin1;
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_> *__range1
  ;
  PrintVisitor visitor;
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
  *in_stack_fffffffffffffee8;
  _List_const_iterator<std::shared_ptr<ExpressionNode>_> *in_stack_fffffffffffffef0;
  ostream *in_stack_fffffffffffffef8;
  PrintVisitor *in_stack_ffffffffffffff00;
  PrintVisitor *in_stack_ffffffffffffff18;
  PrintVisitor *this_00;
  string local_b8 [32];
  reference local_98;
  _Self local_90;
  _Self local_88;
  undefined8 local_80;
  undefined1 local_78 [24];
  PrintVisitor local_60 [2];
  string local_30 [32];
  long *local_10;
  
  poVar2 = *(ostream **)(in_RDI + 8);
  local_10 = in_RSI;
  indent_abi_cxx11_(in_stack_ffffffffffffff18);
  poVar2 = std::operator<<(poVar2,local_30);
  std::operator<<(poVar2,"LambdaCallNode:\n");
  std::__cxx11::string::~string(local_30);
  poVar2 = *(ostream **)(in_RDI + 8);
  this_00 = local_60;
  indent_abi_cxx11_(this_00);
  poVar2 = std::operator<<(poVar2,(string *)this_00);
  std::operator<<(poVar2,"Arguments:\n");
  std::__cxx11::string::~string((string *)local_60);
  PrintVisitor(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (uint)((ulong)in_stack_fffffffffffffef0 >> 0x20));
  local_80 = (**(code **)(*local_10 + 0x18))();
  local_88._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::
       begin(in_stack_fffffffffffffee8);
  local_90._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::end
                 (in_stack_fffffffffffffee8);
  while( true ) {
    bVar1 = std::operator!=(&local_88,&local_90);
    if (!bVar1) break;
    local_98 = std::_List_const_iterator<std::shared_ptr<ExpressionNode>_>::operator*
                         (in_stack_fffffffffffffef0);
    peVar3 = std::__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x168b55);
    (*(peVar3->super_Node)._vptr_Node[2])(peVar3,local_78);
    std::_List_const_iterator<std::shared_ptr<ExpressionNode>_>::operator++(&local_88);
  }
  poVar2 = *(ostream **)(in_RDI + 8);
  indent_abi_cxx11_(this_00);
  poVar2 = std::operator<<(poVar2,local_b8);
  std::operator<<(poVar2,"Lambda:\n");
  std::__cxx11::string::~string(local_b8);
  pLVar4 = LambdaCallNode::getLambda((LambdaCallNode *)0x168c3b);
  (*(pLVar4->super_ExpressionNode).super_Node._vptr_Node[2])(pLVar4,local_78);
  ~PrintVisitor((PrintVisitor *)0x168c67);
  return;
}

Assistant:

void PrintVisitor::visit(const LambdaCallNode& node)
{
  stream_ << indent() << "LambdaCallNode:\n";
  stream_ << indent() << "Arguments:\n";
  auto visitor = PrintVisitor{stream_, indentation_ + 1};
  for(const auto& arg : node.getArguments())
  {
    arg->accept(visitor);
  }
  stream_ << indent() << "Lambda:\n";
  node.getLambda().accept(visitor);
}